

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_emit_block_sequence_item(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  yaml_emitter_state_t **top;
  int *piVar1;
  int iVar2;
  int iVar3;
  yaml_emitter_state_t *pyVar4;
  uint indentless;
  
  if (first != 0) {
    indentless = 0;
    if (emitter->mapping_context != 0) {
      indentless = (uint)(emitter->indention == 0);
    }
    iVar2 = yaml_emitter_increase_indent(emitter,0,indentless);
    if (iVar2 == 0) {
      return 0;
    }
  }
  if (event->type == YAML_SEQUENCE_END_EVENT) {
    pyVar4 = (emitter->states).top;
    piVar1 = (emitter->indents).top;
    (emitter->indents).top = piVar1 + -1;
    emitter->indent = piVar1[-1];
    (emitter->states).top = pyVar4 + -1;
    emitter->state = pyVar4[-1];
    iVar2 = 1;
  }
  else {
    iVar2 = yaml_emitter_write_indent(emitter);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      iVar3 = yaml_emitter_write_indicator(emitter,"-",1,0,1);
      if (iVar3 != 0) {
        pyVar4 = (emitter->states).top;
        if (pyVar4 == (emitter->states).end) {
          top = &(emitter->states).top;
          iVar2 = yaml_stack_extend(&(emitter->states).start,top,&(emitter->states).end);
          if (iVar2 == 0) {
            emitter->error = YAML_MEMORY_ERROR;
            return 0;
          }
          pyVar4 = *top;
        }
        (emitter->states).top = pyVar4 + 1;
        *pyVar4 = YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE;
        iVar2 = yaml_emitter_emit_node(emitter,event,0,1,0,0);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
yaml_emitter_emit_block_sequence_item(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (first)
    {
        if (!yaml_emitter_increase_indent(emitter, 0,
                    (emitter->mapping_context && !emitter->indention)))
            return 0;
    }

    if (event->type == YAML_SEQUENCE_END_EVENT)
    {
        emitter->indent = POP(emitter, emitter->indents);
        emitter->state = POP(emitter, emitter->states);

        return 1;
    }

    if (!yaml_emitter_write_indent(emitter))
        return 0;
    if (!yaml_emitter_write_indicator(emitter, "-", 1, 0, 1))
        return 0;
    if (!PUSH(emitter, emitter->states,
                YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE))
        return 0;

    return yaml_emitter_emit_node(emitter, event, 0, 1, 0, 0);
}